

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O2

void __thiscall pg::ZLKQSolver::solve(ZLKQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  uint *puVar1;
  Game *pGVar2;
  bitset *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int v;
  int iVar14;
  int v_3;
  uint uVar15;
  ulong uVar16;
  _label_vertex local_a8;
  bitset *local_98;
  bitset *local_90;
  bitset *local_88;
  ulong local_80;
  bitset R;
  bitset H;
  
  this->iterations = this->iterations + 1;
  uVar9 = (ulong)(uint)vtop;
  if (po < 1) {
    bitset::operator|=(&this->W0,SG);
    if ((this->super_Solver).trace == 0) {
      return;
    }
    bVar4 = bitset::any(SG);
    if (!bVar4) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"End of precision; presumed won by player 0:");
    while (iVar14 = (int)uVar9, -1 < iVar14) {
      if ((SG->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        poVar7 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        R._bits = (uint64_t *)(this->super_Solver).game;
        R._size._0_4_ = iVar14;
        poVar7 = operator<<(poVar7,(_label_vertex *)&R);
        std::operator<<(poVar7,"\x1b[m");
      }
      uVar9 = (ulong)(iVar14 - 1);
    }
  }
  else {
    if (0 < pe) {
      for (uVar13 = uVar9; -1 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
        if ((SG->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) goto LAB_0014420d;
      }
      uVar13 = uVar9;
      if (-2 < vtop) {
        return;
      }
LAB_0014420d:
      iVar14 = (int)uVar13;
      uVar6 = ((this->super_Solver).game)->_priority[iVar14];
      if ((uVar6 & 1) == 0) {
        uVar11 = pe;
        uVar12 = (uint)po >> 1;
      }
      else {
        uVar11 = (uint)pe >> 1;
        uVar12 = po;
      }
      local_98 = SG;
      solve(this,SG,iVar14,uVar11,uVar12);
      uVar11 = uVar6 & 1;
      if (1 < (this->super_Solver).trace) {
        poVar7 = std::operator<<((this->super_Solver).logger,"in pr=");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
        poVar7 = std::operator<<(poVar7,", pe=");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pe);
        poVar7 = std::operator<<(poVar7,", po=");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,po);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      sVar8 = bitset::count(local_98);
      uVar12 = pe;
      if (uVar11 == 0) {
        uVar12 = po;
      }
      if (sVar8 <= uVar12 >> 1) {
        return;
      }
      local_88 = &this->W0;
      pbVar3 = &this->W1;
      if (uVar11 == 0) {
        local_88 = &this->W1;
        pbVar3 = &this->W0;
      }
      bitset::bitset(&R,local_98);
      local_90 = pbVar3;
      bitset::operator&=(&R,pbVar3);
      for (uVar9 = uVar13; -1 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
        if ((R._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00144367;
      }
      uVar9 = uVar13;
      if (iVar14 < -1) {
LAB_00144367:
        bitset::bitset(&H,((this->super_Solver).game)->n_vertices);
        iVar14 = (int)uVar9;
        uVar13 = (ulong)iVar14;
        local_80 = uVar13;
        for (; (uVar13 != 0xffffffffffffffff &&
               ((((this->super_Solver).game)->_priority[uVar13] & 1U) == uVar11));
            uVar13 = uVar13 - 1) {
          if ((R._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) {
            H._bits[uVar13 >> 6] = H._bits[uVar13 >> 6] | 1L << (uVar13 & 0x3f);
            this->str[uVar13] = -1;
            iVar5 = (this->Q).pointer;
            (this->Q).pointer = iVar5 + 1;
            (this->Q).queue[iVar5] = (uint)uVar13;
            while( true ) {
              iVar5 = (this->Q).pointer;
              if ((long)iVar5 == 0) break;
              (this->Q).pointer = iVar5 + -1;
              attractVertices(this,uVar11,(this->Q).queue[(long)iVar5 + -1],&H,&R,&R);
            }
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
          std::operator<<(poVar7,"\x1b[m");
          sVar8 = bitset::find_last(&H);
          for (; poVar7 = (this->super_Solver).logger, sVar8 != 0xffffffffffffffff;
              sVar8 = bitset::find_prev(&H,sVar8)) {
            poVar7 = std::operator<<(poVar7," \x1b[38;5;38m");
            local_a8.g = (this->super_Solver).game;
            local_a8.v = (int)sVar8;
            poVar7 = operator<<(poVar7,&local_a8);
            std::operator<<(poVar7,"\x1b[m");
          }
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        bitset::operator-=(local_88,&R);
        pbVar3 = local_90;
        bitset::operator-=(local_90,&R);
        bitset::operator|=(pbVar3,&H);
        bitset::operator^=(&H,&R);
        solve(this,&H,iVar14,pe,po);
        puVar1 = (this->Q).queue;
        for (uVar13 = 0; (long)uVar13 <= (long)local_80; uVar13 = uVar13 + 1) {
          if (((H._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
             ((local_88->_bits[uVar13 >> 6] & 1L << (uVar13 & 0x3f)) != 0)) {
            iVar5 = (this->Q).pointer;
            (this->Q).pointer = iVar5 + 1;
            puVar1[iVar5] = (uint)uVar13;
          }
        }
        iVar5 = (this->Q).pointer;
        if (iVar5 == 0) {
          uVar12 = 0;
        }
        else {
          local_80 = local_80 & 0xffffffff00000000;
          while (iVar5 != 0) {
            (this->Q).pointer = iVar5 + -1;
            uVar15 = (this->Q).queue[(long)iVar5 + -1];
            uVar16 = (ulong)(int)uVar15;
            uVar13 = *(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver +
                                         ((ulong)(uVar11 << 5) | 0x50)) + (uVar16 >> 6) * 8);
            if ((uVar13 >> (uVar16 & 0x3f) & 1) != 0) {
              local_80 = CONCAT44(local_80._4_4_,(int)CONCAT71((int7)(uVar13 >> 8),1));
              if (((this->super_Solver).trace != 0) &&
                 (((this->super_Solver).game)->_priority[uVar16] == uVar6)) {
                poVar7 = std::operator<<((this->super_Solver).logger,
                                         "\x1b[1;37mfound distraction\x1b[m: ");
                local_a8.g = (this->super_Solver).game;
                local_a8.v = uVar15;
                poVar7 = operator<<(poVar7,&local_a8);
                std::endl<char,std::char_traits<char>>(poVar7);
              }
            }
            attractVertices(this,uVar11 ^ 1,uVar15,local_88,&R,&R);
            iVar5 = (this->Q).pointer;
          }
          uVar12 = (uint)local_80;
        }
        if (1 < (this->super_Solver).trace) {
          poVar7 = std::operator<<((this->super_Solver).logger,"Subgame of (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
          poVar7 = std::operator<<(poVar7," pe=");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pe);
          poVar7 = std::operator<<(poVar7," po=");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,po);
          std::operator<<(poVar7,"):");
          uVar13 = uVar9;
          while (uVar15 = (uint)uVar13, -1 < (int)uVar15) {
            uVar16 = uVar13 >> 6;
            if ((local_98->_bits[uVar16] >> (uVar13 & 0x3f) & 1) != 0) {
              uVar13 = 1L << (uVar13 & 0x3f);
              if ((R._bits[uVar16] & uVar13) == 0) {
                poVar7 = std::operator<<((this->super_Solver).logger," \x1b[38;5;160m");
                local_a8.g = (this->super_Solver).game;
                local_a8.v = uVar15;
                poVar7 = operator<<(poVar7,&local_a8);
                std::operator<<(poVar7,"\x1b[m");
              }
              else if ((local_90->_bits[uVar16] & uVar13) == 0) {
                poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;196m");
                local_a8.g = (this->super_Solver).game;
                local_a8.v = uVar15;
                poVar7 = operator<<(poVar7,&local_a8);
                std::operator<<(poVar7,"\x1b[m");
              }
              else if ((local_88->_bits[uVar16] & uVar13) == 0) {
                poVar7 = (this->super_Solver).logger;
                if ((H._bits[uVar16] & uVar13) == 0) {
                  poVar7 = std::operator<<(poVar7," \x1b[1;38;5;46m");
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = uVar15;
                  poVar7 = operator<<(poVar7,&local_a8);
                  std::operator<<(poVar7,"\x1b[m");
                }
                else {
                  poVar7 = std::operator<<(poVar7," \x1b[38;5;38m");
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = uVar15;
                  poVar7 = operator<<(poVar7,&local_a8);
                  std::operator<<(poVar7,"\x1b[m");
                }
              }
              else {
                poVar7 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
                local_a8.g = (this->super_Solver).game;
                local_a8.v = uVar15;
                poVar7 = operator<<(poVar7,&local_a8);
                std::operator<<(poVar7,"\x1b[m");
              }
            }
            uVar13 = (ulong)(uVar15 - 1);
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        if ((uVar12 & 1) == 0) {
          while (iVar14 = (int)uVar9, -1 < iVar14) {
            if (((((R._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) &&
                 ((local_90->_bits[uVar9 >> 6] & 1L << (uVar9 & 0x3f)) != 0)) &&
                (uVar6 = Solver::owner(&this->super_Solver,iVar14), uVar6 == uVar11)) &&
               (this->str[uVar9] == -1)) {
              pGVar2 = (this->super_Solver).game;
              piVar10 = pGVar2->_outedges + pGVar2->_firstouts[uVar9];
              do {
                iVar5 = *piVar10;
                uVar13 = (ulong)iVar5;
                if (uVar13 == 0xffffffffffffffff) goto LAB_0014491d;
                piVar10 = piVar10 + 1;
              } while ((local_90->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0);
              this->str[uVar9] = iVar5;
            }
LAB_0014491d:
            uVar9 = (ulong)(iVar14 - 1);
          }
        }
        else {
          bitset::operator-=(local_90,&R);
          bitset::operator-=(&R,local_88);
          while (iVar5 = (int)uVar9, -1 < iVar5) {
            if ((R._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00144930;
            uVar9 = (ulong)(iVar5 - 1);
          }
          iVar5 = iVar14;
          if (iVar14 < -1) {
LAB_00144930:
            solve(this,&R,iVar5,(uint)pe >> uVar11,(uint)po >> ((byte)uVar11 ^ 1));
          }
        }
        bitset::~bitset(&H);
      }
      bitset::~bitset(&R);
      return;
    }
    bitset::operator|=(&this->W1,SG);
    if ((this->super_Solver).trace == 0) {
      return;
    }
    bVar4 = bitset::any(SG);
    if (!bVar4) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"End of precision; presumed won by player 1:");
    while (iVar14 = (int)uVar9, -1 < iVar14) {
      if ((SG->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        poVar7 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        R._bits = (uint64_t *)(this->super_Solver).game;
        R._size._0_4_ = iVar14;
        poVar7 = operator<<(poVar7,(_label_vertex *)&R);
        std::operator<<(poVar7,"\x1b[m");
      }
      uVar9 = (ulong)(iVar14 - 1);
    }
  }
  std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
  return;
}

Assistant:

void
ZLKQSolver::solve(bitset &SG, int vtop, const int pe, const int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     * We use several implementation tricks to make optimal use of memory and allocate as few as possible
     * For example, we record partial winning sets for Even and Odd in W0 and W1, because all partial
     * winning sets between calls are disjoint (so, safe to share the same bit array)
     */

    /**
     * Record the number of recursive calls (visits)
     */

    iterations++;

    /**
     * Check if we have run out of precision / nodes! (parameter n)
     * If our opponent's precision is gone, assume it's all won by us.
     * If our own precision is gone, assume it's all won by the opponent.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    while (vtop >= 0 and !SG[vtop]) vtop--;

    /**
     * Check if the game is empty
     */
    if (vtop == -1) return; // empty game, bye

    /**
     * Optimization: set pr/pl to top priority/player
     * This is like taking a shortcut in the Tree
     */

    const int pr = priority(vtop);
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    /**
     * If the remaining subgame size <= po/2 cq pe/2 then we don't need to continue after the recursion.
     *   (this optimization is due to Lehtinen, Parys, Schewe, Wojtczak '21)
     */

    if (pl == 0) {
        if (SG.count() <= (unsigned long)(po/2)) return;
    } else {
        if (SG.count() <= (unsigned long)(pe/2)) return;
    }

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Now compute <R> := vertices in subgame that we won in the left side
     * That is, the intersection of SG and Wm.
     *
     * Consider R to be the game that remains after the steps on the left in the universal tree.
     * Fmore, SG is immutable, R is a local bitset
     */

    bitset R(SG);
    R &= Wm;

    /**
     * Update vtop to the highest vertex in the intersection
     */
    while (vtop >= 0 and !R[vtop]) vtop--;
    if (vtop == -1) return;

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */
    bitset H(nodecount());

    for (int v=vtop; v!=-1; v--) {
        // if (priority(v) != pr) break; // stop attracting ... ;) [todo: add otf compression ?]
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        if (R[v]) {
            H[v] = true;
            str[v] = -1;
            Q.push(v);
            while (Q.nonempty()) {
                attractVertices(pl, Q.pop(), H, R, R);
            }
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }
#endif

    /**
     * Reset Wo and Wm for vertices in <R> - <H>;
     * Set H to the remaining subgame (G' in the universal paper)
     */

    // reset opponent and our region
    Wo -= R;
    Wm -= R;
    // but set everything in H to ours
    Wm |= H;
    // and set H := R - H
    H ^= R;

    /**
     * Go recursive!
     */
    solve(H, vtop, pe, po);

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */
    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (H[v] and Wo[v]) Q.push(v);
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) {
#ifndef NDEBUG
                if (trace and priority(v) == pr) {
                    logger << "\033[1;37mfound distraction\033[m: " << label_vertex(v) << std::endl;
                }
#endif
                opponent_attracted_from_us = true;
            }
            attractVertices(1-pl, v, Wo, R, R);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        logger << "Subgame of (" << pr << " pe=" << pe << " po=" << po << "):";
        for (int v=vtop; v>=0; v--) {
            if (SG[v]) {
                if (R[v]) {
                    if (Wm[v]) {
                        if (Wo[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
                        else if (!H[v]) logger << " \033[1;38;5;46m" << label_vertex(v) << "\033[m";
                        else logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                    }
                    else logger << " \033[1;38;5;196m" << label_vertex(v) << "\033[m";
                }
                else logger << " \033[38;5;160m" << label_vertex(v) << "\033[m";
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side
     * of the universal tree. Otherwise: update strategies and return.
     * Notice this is also an optimization.
     */
    if (opponent_attracted_from_us) {
        // Reset my winning region <Wm>
        Wm -= R;

        // Reduce subgame by removing opponent's winning region <Wo>
        R -= Wo;

        // Update vtop
        while (vtop >= 0 and !R[vtop]) vtop--;

        // Check if the game is empty
        if (vtop == -1) return; // empty game, bye

        // Expand the right side of the current level of the universal tree
        if (pl == 0) solve(R, vtop, pe, po/2);
        else solve(R, vtop, pe/2, po);
    } else {
        // Set strategy for vertices that do not yet have a strategy
        for (int v=vtop; v>=0; v--) {
            if (R[v] and Wm[v] and owner(v) == pl and str[v] == -1) {
                auto curedge = outs(v);
                for (int to = *curedge; to != -1; to = *++curedge) {
                    if (Wm[to]) {
                        str[v] = to;
                        break;
                    }
                }
            }
        }
    }
}